

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace_printer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::NamespacePrinter::~NamespacePrinter(NamespacePrinter *this)

{
  Printer *this_00;
  Arg *in_R8;
  pointer pbVar1;
  string_view text;
  string_view format;
  string local_80;
  size_type local_60;
  pointer local_58;
  
  for (pbVar1 = (this->namespace_components_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar1 != (this->namespace_components_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar1 = pbVar1 + -1) {
    this_00 = this->p_;
    local_58 = pbVar1[-1]._M_dataplus._M_p;
    local_60 = pbVar1[-1]._M_string_length;
    format._M_str = (char *)&local_60;
    format._M_len = (size_t)"}  // namespace $0\n";
    absl::lts_20250127::Substitute_abi_cxx11_(&local_80,(lts_20250127 *)&DAT_00000013,format,in_R8);
    text._M_str = local_80._M_dataplus._M_p;
    text._M_len = local_80._M_string_length;
    io::Printer::Print<>(this_00,text);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->namespace_components_);
  return;
}

Assistant:

NamespacePrinter::~NamespacePrinter() {
  // Close the namespace.
  for (auto it = namespace_components_.rbegin();
       it != namespace_components_.rend(); ++it) {
    p_->Print(absl::Substitute("}  // namespace $0\n", *it));
  }
}